

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize)

{
  ZSTD_Sequence *pZVar1;
  BYTE *pBVar2;
  BYTE **ppBVar3;
  uint uVar4;
  uint uVar5;
  ZSTD_CDict *pZVar6;
  BYTE *pBVar7;
  ZSTD_compressedBlockState_t *pZVar8;
  undefined8 uVar9;
  BYTE *ip;
  U32 offset;
  ulong uVar10;
  seqDef *psVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  uint rawOffset;
  U32 local_70 [3];
  ulong local_60;
  ulong local_58;
  BYTE *local_50;
  BYTE *litLimit_w;
  ZSTD_Sequence *local_40;
  BYTE *local_38;
  
  local_50 = (BYTE *)(blockSize + (long)src);
  pZVar6 = cctx->cdict;
  if (pZVar6 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_60 = 0;
      goto LAB_001a76d1;
    }
    pZVar6 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_60 = (ulong)(uint)pZVar6->dictContentSize;
LAB_001a76d1:
  uVar13 = seqPos->idx;
  local_70 = *&((cctx->blockState).prevCBlock)->rep;
  litLimit_w = local_50 + -0x20;
  local_58 = inSeqsSize;
  local_40 = inSeqs;
  do {
    uVar14 = (ulong)uVar13;
    pZVar1 = local_40 + uVar14;
    uVar4 = local_40[uVar14].matchLength;
    if (uVar4 == 0) {
      if ((local_58 <= uVar14) || (rawOffset = pZVar1->offset, rawOffset == 0)) goto LAB_001a7921;
    }
    else {
      if (local_58 <= uVar14) {
LAB_001a7921:
        pZVar8 = (cctx->blockState).nextCBlock;
        pZVar8->rep[2] = local_70[2];
        *(undefined8 *)pZVar8->rep = local_70._0_8_;
        uVar14 = (ulong)pZVar1->litLength;
        if (uVar14 != 0) {
          memcpy((cctx->seqStore).lit,src,uVar14);
          ppBVar3 = &(cctx->seqStore).lit;
          *ppBVar3 = *ppBVar3 + uVar14;
          src = (void *)((long)src + (ulong)pZVar1->litLength);
          seqPos->posInSrc = seqPos->posInSrc + (ulong)pZVar1->litLength;
        }
        if ((BYTE *)src != local_50) {
          return 0xffffffffffffffec;
        }
        seqPos->idx = uVar13 + 1;
        return 0;
      }
      rawOffset = pZVar1->offset;
    }
    uVar5 = pZVar1->litLength;
    uVar14 = (ulong)uVar5;
    local_38 = (BYTE *)src;
    offset = ZSTD_finalizeOffCode(rawOffset,local_70,(uint)(uVar14 == 0));
    ip = local_38;
    local_70 = (U32  [3])ZSTD_updateRep(local_70,offset,(uint)(uVar14 == 0));
    if ((cctx->appliedParams).validateSequences != 0) {
      uVar12 = (ulong)(uVar5 + uVar4) + seqPos->posInSrc;
      seqPos->posInSrc = uVar12;
      uVar15 = 1L << ((byte)(cctx->appliedParams).cParams.windowLog & 0x3f);
      uVar10 = local_60 + uVar12;
      if (uVar15 < uVar12) {
        uVar10 = uVar15;
      }
      if ((uVar4 < (cctx->appliedParams).cParams.minMatch) || (uVar10 + 2 < (ulong)offset)) {
        return 0xffffffffffffffec;
      }
    }
    if ((cctx->seqStore).maxNbSeq < (ulong)(uVar13 - seqPos->idx)) {
      return 0xffffffffffffffc0;
    }
    pBVar7 = (cctx->seqStore).lit;
    if (litLimit_w < ip + uVar14) {
      ZSTD_safecopyLiterals(pBVar7,ip,ip + uVar14,litLimit_w);
LAB_001a7820:
      ppBVar3 = &(cctx->seqStore).lit;
      *ppBVar3 = *ppBVar3 + uVar14;
      psVar11 = (cctx->seqStore).sequences;
      if (0xffff < uVar5) {
        (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar11 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
    }
    else {
      uVar9 = *(undefined8 *)(ip + 8);
      *(undefined8 *)pBVar7 = *(undefined8 *)ip;
      *(undefined8 *)(pBVar7 + 8) = uVar9;
      if (0x10 < uVar5) {
        pBVar7 = (cctx->seqStore).lit;
        uVar9 = *(undefined8 *)(ip + 0x18);
        *(undefined8 *)(pBVar7 + 0x10) = *(undefined8 *)(ip + 0x10);
        *(undefined8 *)(pBVar7 + 0x18) = uVar9;
        if (0x10 < uVar14 - 0x10) {
          lVar16 = 0;
          do {
            uVar9 = *(undefined8 *)(ip + lVar16 + 0x20 + 8);
            pBVar2 = pBVar7 + lVar16 + 0x20;
            *(undefined8 *)pBVar2 = *(undefined8 *)(ip + lVar16 + 0x20);
            *(undefined8 *)(pBVar2 + 8) = uVar9;
            uVar9 = *(undefined8 *)(ip + lVar16 + 0x30 + 8);
            *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)(ip + lVar16 + 0x30);
            *(undefined8 *)(pBVar2 + 0x18) = uVar9;
            lVar16 = lVar16 + 0x20;
          } while (pBVar2 + 0x20 < pBVar7 + uVar14);
          goto LAB_001a7820;
        }
      }
      ppBVar3 = &(cctx->seqStore).lit;
      *ppBVar3 = *ppBVar3 + uVar14;
      psVar11 = (cctx->seqStore).sequences;
    }
    psVar11->litLength = (U16)uVar5;
    psVar11->offset = offset + 1;
    if (0xffff < uVar4 - 3) {
      (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
      (cctx->seqStore).longLengthPos =
           (U32)((ulong)((long)psVar11 - (long)(cctx->seqStore).sequencesStart) >> 3);
    }
    psVar11->matchLength = (U16)(uVar4 - 3);
    (cctx->seqStore).sequences = psVar11 + 1;
    src = ip + (uVar5 + uVar4);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

static size_t ZSTD_copySequencesToSeqStoreExplicitBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                                             const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                                             const void* src, size_t blockSize) {
    U32 idx = seqPos->idx;
    BYTE const* ip = (BYTE const*)(src);
    const BYTE* const iend = ip + blockSize;
    repcodes_t updatedRepcodes;
    U32 dictSize;
    U32 litLength;
    U32 matchLength;
    U32 ll0;
    U32 offCode;

    if (cctx->cdict) {
        dictSize = (U32)cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = (U32)cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    for (; (inSeqs[idx].matchLength != 0 || inSeqs[idx].offset != 0) && idx < inSeqsSize; ++idx) {
        litLength = inSeqs[idx].litLength;
        matchLength = inSeqs[idx].matchLength;
        ll0 = litLength == 0;
        offCode = ZSTD_finalizeOffCode(inSeqs[idx].offset, updatedRepcodes.rep, ll0);
        updatedRepcodes = ZSTD_updateRep(updatedRepcodes.rep, offCode, ll0);

        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offCode, matchLength, litLength);
        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offCode, matchLength, seqPos->posInSrc,
                                                cctx->appliedParams.cParams.windowLog, dictSize,
                                                cctx->appliedParams.cParams.minMatch),
                                                "Sequence validation failed");
        }
        RETURN_ERROR_IF(idx - seqPos->idx > cctx->seqStore.maxNbSeq, memory_allocation,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offCode, matchLength - MINMATCH);
        ip += matchLength + litLength;
    }
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    if (inSeqs[idx].litLength) {
        DEBUGLOG(6, "Storing last literals of size: %u", inSeqs[idx].litLength);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, inSeqs[idx].litLength);
        ip += inSeqs[idx].litLength;
        seqPos->posInSrc += inSeqs[idx].litLength;
    }
    RETURN_ERROR_IF(ip != iend, corruption_detected, "Blocksize doesn't agree with block delimiter!");
    seqPos->idx = idx+1;
    return 0;
}